

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Rsa.h
# Opt level: O0

bool __thiscall
axl::cry::Rsa::verifyHash
          (Rsa *this,int type,void *hash,size_t hashSize,void *signature,size_t signatureSize)

{
  int iVar1;
  uint in_ECX;
  uchar *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  uchar *in_R8;
  uint in_R9D;
  
  iVar1 = RSA_verify(in_ESI,in_RDX,in_ECX,in_R8,in_R9D,(RSA *)*in_RDI);
  return iVar1 == 1;
}

Assistant:

bool
	verifyHash(
		int type,
		const void* hash,
		size_t hashSize,
		const void* signature,
		size_t signatureSize
	) {
		return RSA_verify(
			type,
			(const uchar_t*)hash,
			(int)hashSize,
			(const uchar_t*)signature,
			(int)signatureSize,
			m_h
		) == 1;
	}